

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsModule.c
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  MCRegisterInfo *MRI;
  MCRegisterInfo *mri;
  cs_struct *ud_local;
  
  if ((*(uint *)(ctx + 4) & 0x7fffffff) == 0) {
    MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
    AArch64_init(MRI);
    *(code **)(ctx + 8) = AArch64_printInst;
    *(MCRegisterInfo **)(ctx + 0x10) = MRI;
    *(MCRegisterInfo **)(ctx + 0x20) = MRI;
    *(code **)(ctx + 0x18) = AArch64_getInstruction;
    *(code **)(ctx + 0x30) = AArch64_reg_name;
    *(code **)(ctx + 0x48) = AArch64_get_insn_id;
    *(code **)(ctx + 0x38) = AArch64_insn_name;
    *(code **)(ctx + 0x40) = AArch64_group_name;
    *(code **)(ctx + 0x50) = AArch64_post_printer;
    ud_local._4_4_ = 0;
  }
  else {
    ud_local._4_4_ = 5;
  }
  return ud_local._4_4_;
}

Assistant:

static cs_err init(cs_struct *ud)
{
	MCRegisterInfo *mri;

	// verify if requested mode is valid
	if (ud->mode & ~(CS_MODE_LITTLE_ENDIAN | CS_MODE_32 | CS_MODE_64 |
				CS_MODE_MICRO | CS_MODE_MIPS32R6 |
				CS_MODE_MIPSGP64 | CS_MODE_BIG_ENDIAN))
		return CS_ERR_MODE;

	mri = cs_mem_malloc(sizeof(*mri));

	Mips_init(mri);
	ud->printer = Mips_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->reg_name = Mips_reg_name;
	ud->insn_id = Mips_get_insn_id;
	ud->insn_name = Mips_insn_name;
	ud->group_name = Mips_group_name;

	if (ud->mode & CS_MODE_32 || ud->mode & CS_MODE_MIPS32R6)
		ud->disasm = Mips_getInstruction;
	else
		ud->disasm = Mips64_getInstruction;

	return CS_ERR_OK;
}